

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O2

void __thiscall OrderMoney::OrderMoney(OrderMoney *this,shared_ptr<const_Money> *a)

{
  undefined8 uVar1;
  undefined1 local_4c [60];
  
  (this->super_Money)._vptr_Money = (_func_int **)&PTR__OrderMoney_001292e0;
  std::__shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>,
             &a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>);
  local_4c._0_4_ = 0;
  (*((a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Money[3])
            (local_4c + 0x1c);
  std::make_shared<RealMoney,int,std::__cxx11::string>
            ((int *)(local_4c + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c);
  uVar1 = local_4c._12_8_;
  local_4c._12_8_ = 0;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_4c._4_8_;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  local_4c._4_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4c + 0xc));
  std::__cxx11::string::~string((string *)(local_4c + 0x1c));
  return;
}

Assistant:

OrderMoney::OrderMoney(const shared_ptr<const Money> &a)
	: a(a), b(make_shared<RealMoney>(0, a->currency()))
{
}